

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDComponentPtrPair::CompareFirstPointer
              (ON_SubDComponentPtrPair *lhs,ON_SubDComponentPtrPair *rhs)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (lhs == rhs) {
    return 0;
  }
  if (rhs == (ON_SubDComponentPtrPair *)0x0) {
    iVar1 = -1;
  }
  else {
    if (lhs != (ON_SubDComponentPtrPair *)0x0) {
      uVar3 = lhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
      uVar4 = rhs->m_pair[0].m_ptr & 0xfffffffffffffff8;
      uVar2 = 0xffffffff;
      if (uVar4 <= uVar3) {
        uVar2 = (uint)(uVar4 < uVar3);
      }
      return uVar2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int ON_SubDComponentPtrPair::CompareFirstPointer(
  const ON_SubDComponentPtrPair* lhs,
  const ON_SubDComponentPtrPair* rhs
)
{
  if (lhs == rhs)
    return 0;
  // nulls sort to end.
  if (nullptr == rhs)
    return -1;
  if (nullptr == lhs)
    return 1;
  const ON__UINT_PTR lhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & lhs->m_pair[0].m_ptr);
  const ON__UINT_PTR rhs_ptr = (ON_SUBD_COMPONENT_POINTER_MASK & rhs->m_pair[0].m_ptr);
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;
  return 0;
}